

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterable_feature.cc
# Opt level: O3

ostream * range_to_stream<ezy::strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>const>>>>>>,void,ezy::features::iterable>>
                    (ostream *ostr,
                    strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>
                    *range)

{
  reference pvVar1;
  ostream *poVar2;
  int *e;
  int *piVar3;
  size_type sVar4;
  size_type sVar5;
  strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>
  *__range1;
  
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"[",1);
  sVar4 = (range->
          super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
          ).
          super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
          ._value.n;
  if (sVar4 != 0) {
    sVar5 = *(size_type *)
             ((long)&(range->
                     super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
                     ).
                     super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
                     ._value.range.t.range.t + 8);
    piVar3 = (((range->
               super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
               ).
               super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
               ._value.range.t.range.t.range.t)->super__Vector_base<int,_std::allocator<int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    do {
      poVar2 = (ostream *)std::ostream::operator<<(ostr,*piVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      pvVar1 = (range->
               super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
               ).
               super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
               ._value.range.t.range.t.range.t;
      sVar5 = sVar5 - 1;
      if ((sVar5 == 0) ||
         (piVar3 = piVar3 + 1,
         piVar3 == (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish)) {
        sVar5 = *(size_type *)
                 ((long)&(range->
                         super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
                         ).
                         super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
                         ._value.range.t.range.t + 8);
        piVar3 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"]",1);
  return ostr;
}

Assistant:

std::ostream& range_to_stream(std::ostream& ostr, const RangeType& range)
{
  ostr << "[";
  for (const auto& e : range)
    element_to_stream(ostr, e) << ", ";

  return ostr << "]";
}